

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O2

int alsa_stream_get_position(cubeb_stream_conflict1 *stm,uint64_t *position)

{
  snd_pcm_state_t sVar1;
  int iVar2;
  uint64_t uVar3;
  snd_pcm_sframes_t delay;
  ulong local_20;
  
  pthread_mutex_lock((pthread_mutex_t *)&stm->mutex);
  local_20 = 0xffffffffffffffff;
  sVar1 = (*cubeb_snd_pcm_state)(stm->pcm);
  if (sVar1 == SND_PCM_STATE_RUNNING) {
    iVar2 = (*cubeb_snd_pcm_delay)(stm->pcm,(snd_pcm_sframes_t *)&local_20);
    if (iVar2 == 0) {
      *position = 0;
      uVar3 = stm->stream_position - local_20;
      if (stm->stream_position < local_20) {
        uVar3 = 0;
      }
      else {
        *position = uVar3;
      }
      stm->last_position = uVar3;
      goto LAB_00128ce1;
    }
  }
  *position = stm->last_position;
LAB_00128ce1:
  pthread_mutex_unlock((pthread_mutex_t *)&stm->mutex);
  return 0;
}

Assistant:

static int
alsa_stream_get_position(cubeb_stream * stm, uint64_t * position)
{
  snd_pcm_sframes_t delay;

  assert(stm && position);

  pthread_mutex_lock(&stm->mutex);

  delay = -1;
  if (WRAP(snd_pcm_state)(stm->pcm) != SND_PCM_STATE_RUNNING ||
      WRAP(snd_pcm_delay)(stm->pcm, &delay) != 0) {
    *position = stm->last_position;
    pthread_mutex_unlock(&stm->mutex);
    return CUBEB_OK;
  }

  assert(delay >= 0);

  *position = 0;
  if (stm->stream_position >= (snd_pcm_uframes_t) delay) {
    *position = stm->stream_position - delay;
  }

  stm->last_position = *position;

  pthread_mutex_unlock(&stm->mutex);
  return CUBEB_OK;
}